

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O2

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(soul::AST::Graph&)::CycleDetector::
CycleDetector(soul::AST::Graph__(void *this,Graph *graph)

{
  pointer ppVar1;
  pointer ppVar2;
  ProcessorInstance *source;
  ProcessorInstance *dest;
  pointer ppVar3;
  pool_ref<soul::AST::ProcessorInstance> *p;
  pointer ppVar4;
  pool_ptr<soul::AST::ProcessorInstance> dst;
  pool_ptr<soul::AST::ProcessorInstance> src;
  undefined1 local_40 [8];
  _func_int **local_38;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)((long)this + 8) = 0;
  *(undefined8 *)((long)this + 0x10) = 0;
  std::
  vector<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node,_std::allocator<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node>_>
  ::reserve((vector<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node,_std::allocator<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node>_>
             *)this,(long)(graph->processorInstances).
                          super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(graph->processorInstances).
                          super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3);
  ppVar1 = (graph->processorInstances).
           super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar4 = (graph->processorInstances).
                super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar1; ppVar4 = ppVar4 + 1) {
    heart::Utilities::
    GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
    ::addNode((GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
               *)this,ppVar4->object);
  }
  ppVar2 = (graph->connections).
           super__Vector_base<soul::pool_ref<soul::AST::Connection>,_std::allocator<soul::pool_ref<soul::AST::Connection>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar3 = (graph->connections).
                super__Vector_base<soul::pool_ref<soul::AST::Connection>,_std::allocator<soul::pool_ref<soul::AST::Connection>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar2; ppVar3 = ppVar3 + 1) {
    if ((ppVar3->object->delayLength).object == (Expression *)0x0) {
      soul::AST::Connection::getSourceProcessor((Connection *)&stack0xffffffffffffffc8);
      if (local_38 != (_func_int **)0x0) {
        soul::AST::Connection::getDestProcessor((Connection *)local_40);
        if (local_40 != (undefined1  [8])0x0) {
          source = pool_ptr<soul::AST::ProcessorInstance>::operator*
                             ((pool_ptr<soul::AST::ProcessorInstance> *)&stack0xffffffffffffffc8);
          dest = pool_ptr<soul::AST::ProcessorInstance>::operator*
                           ((pool_ptr<soul::AST::ProcessorInstance> *)local_40);
          heart::Utilities::
          GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
          ::addConnection((GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
                           *)this,source,dest,ppVar3->object);
        }
      }
    }
  }
  return;
}

Assistant:

CycleDetector (AST::Graph& graph)
                {
                    reserve (graph.processorInstances.size());

                    for (auto& p : graph.processorInstances)
                        addNode (p);

                    for (auto& c : graph.connections)
                        if (c->delayLength == nullptr)
                            if (auto src = c->getSourceProcessor())
                                if (auto dst = c->getDestProcessor())
                                    addConnection (*src, *dst, c);
                }